

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmString.hxx
# Opt level: O2

void __thiscall cm::String::String(String *this,initializer_list<char> il)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_30,il._M_array,il._M_array + il._M_len);
  String<std::__cxx11::string,void>(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

String(std::initializer_list<char> il)
    : String(std::string(il))
  {
  }